

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_depth_clamp_control
          (Impl *this,Value *state,VkPipelineViewportDepthClampControlCreateInfoEXT **out_info)

{
  bool bVar1;
  VkDepthClampModeEXT VVar2;
  VkPipelineViewportDepthClampControlCreateInfoEXT *pVVar3;
  Type pGVar4;
  VkDepthClampRangeEXT *pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  float fVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  VkDepthClampRangeEXT *range;
  VkPipelineViewportDepthClampControlCreateInfoEXT *info;
  VkPipelineViewportDepthClampControlCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkPipelineViewportDepthClampControlCreateInfoEXT>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthClampMode");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->depthClampMode = VVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"depthClampRange");
  if (bVar1) {
    pVVar5 = ScratchAllocator::allocate_cleared<VkDepthClampRangeEXT>(&this->allocator);
    pVVar3->pDepthClampRange = pVVar5;
    this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)state,"depthClampRange");
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"minDepthClamp");
    fVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetFloat(pGVar4);
    pVVar5->minDepthClamp = fVar6;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"maxDepthClamp");
    fVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetFloat(pGVar4);
    pVVar5->maxDepthClamp = fVar6;
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_depth_clamp_control(const Value &state, VkPipelineViewportDepthClampControlCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineViewportDepthClampControlCreateInfoEXT>();
	info->depthClampMode = static_cast<VkDepthClampModeEXT>(state["depthClampMode"].GetUint());
	if (state.HasMember("depthClampRange"))
	{
		auto *range = allocator.allocate_cleared<VkDepthClampRangeEXT>();
		info->pDepthClampRange = range;
		auto &v = state["depthClampRange"];
		range->minDepthClamp = v["minDepthClamp"].GetFloat();
		range->maxDepthClamp = v["maxDepthClamp"].GetFloat();
	}
	*out_info = info;
	return true;
}